

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.cpp
# Opt level: O0

bool __thiscall Json::OurReader::readObject(OurReader *this,Token *token)

{
  bool bVar1;
  Value *this_00;
  ulong uVar2;
  long in_RSI;
  long in_RDI;
  OurReader *in_stack_00000008;
  bool finalizeTokenOk;
  Token comma;
  bool ok;
  Value *value;
  Token colon;
  String msg;
  Value numberName;
  bool initialTokenOk;
  Value init;
  String name;
  Token tokenName;
  undefined4 in_stack_fffffffffffffd78;
  TokenType in_stack_fffffffffffffd7c;
  undefined7 in_stack_fffffffffffffd80;
  undefined1 in_stack_fffffffffffffd87;
  String *in_stack_fffffffffffffd88;
  String *message;
  undefined5 in_stack_fffffffffffffd90;
  undefined1 in_stack_fffffffffffffd95;
  undefined1 in_stack_fffffffffffffd96;
  undefined1 in_stack_fffffffffffffd97;
  Token *in_stack_fffffffffffffd98;
  allocator *paVar3;
  undefined5 in_stack_fffffffffffffda0;
  undefined1 in_stack_fffffffffffffda5;
  undefined1 in_stack_fffffffffffffda6;
  undefined1 in_stack_fffffffffffffda7;
  Value *in_stack_fffffffffffffda8;
  ValueType type;
  Value *in_stack_fffffffffffffdb0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdc0;
  undefined5 in_stack_fffffffffffffdc8;
  undefined1 in_stack_fffffffffffffdcd;
  undefined1 in_stack_fffffffffffffdce;
  bool local_21a;
  undefined1 local_1f9 [39];
  bool local_1d2;
  allocator local_1d1;
  string local_1d0 [24];
  Value *in_stack_fffffffffffffe48;
  int in_stack_fffffffffffffe50;
  undefined4 in_stack_fffffffffffffe54;
  OurReader *in_stack_fffffffffffffe58;
  allocator local_179;
  string local_178 [32];
  int local_158;
  string local_140 [32];
  string local_120 [39];
  allocator local_f9;
  string local_f8 [32];
  string local_d8 [76];
  uint local_8c;
  bool local_85;
  Value *in_stack_ffffffffffffff98;
  string local_50 [32];
  int local_30;
  long local_18;
  byte local_1;
  
  local_18 = in_RSI;
  std::__cxx11::string::string(local_50);
  Value::Value(in_stack_fffffffffffffdb0,(ValueType)((ulong)in_stack_fffffffffffffda8 >> 0x20));
  currentValue((OurReader *)0x1ebfb5);
  Value::swapPayload((Value *)CONCAT17(in_stack_fffffffffffffd87,in_stack_fffffffffffffd80),
                     (Value *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
  this_00 = currentValue((OurReader *)0x1ebfdd);
  Value::setOffsetStart(this_00,*(long *)(local_18 + 8) - *(long *)(in_RDI + 0xc0));
  while (bVar1 = readToken((OurReader *)
                           CONCAT17(in_stack_fffffffffffffda7,
                                    CONCAT16(in_stack_fffffffffffffda6,
                                             CONCAT15(in_stack_fffffffffffffda5,
                                                      in_stack_fffffffffffffda0))),
                           in_stack_fffffffffffffd98), bVar1) {
    local_85 = true;
    while( true ) {
      type = (ValueType)((ulong)in_stack_fffffffffffffda8 >> 0x20);
      local_21a = false;
      if (local_30 == 0xf) {
        local_21a = local_85;
      }
      if (local_21a == false) break;
      local_85 = readToken((OurReader *)
                           CONCAT17(in_stack_fffffffffffffda7,
                                    CONCAT16(in_stack_fffffffffffffda6,
                                             CONCAT15(in_stack_fffffffffffffda5,
                                                      in_stack_fffffffffffffda0))),
                           in_stack_fffffffffffffd98);
    }
    if (local_85 == false) break;
    if ((local_30 == 2) && (uVar2 = std::__cxx11::string::empty(), (uVar2 & 1) != 0)) {
      local_1 = 1;
      local_8c = 1;
      goto LAB_001ec8c2;
    }
    std::__cxx11::string::clear();
    if (local_30 == 5) {
      bVar1 = decodeString(in_stack_fffffffffffffe58,
                           (Token *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                           (String *)in_stack_fffffffffffffe48);
      if (!bVar1) {
        local_1 = recoverFromError((OurReader *)
                                   CONCAT17(in_stack_fffffffffffffda7,
                                            CONCAT16(in_stack_fffffffffffffda6,
                                                     CONCAT15(in_stack_fffffffffffffda5,
                                                              in_stack_fffffffffffffda0))),
                                   (TokenType)((ulong)in_stack_fffffffffffffd98 >> 0x20));
        local_8c = 1;
        goto LAB_001ec8c2;
      }
    }
    else {
      if ((local_30 != 6) || ((*(byte *)(in_RDI + 0x10b) & 1) == 0)) break;
      Value::Value(in_stack_fffffffffffffdb0,type);
      bVar1 = decodeNumber(in_stack_fffffffffffffe58,
                           (Token *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                           in_stack_fffffffffffffe48);
      if (bVar1) {
        Value::asString_abi_cxx11_(in_stack_ffffffffffffff98);
        std::__cxx11::string::operator=(local_50,local_d8);
        std::__cxx11::string::~string(local_d8);
      }
      else {
        local_1 = recoverFromError((OurReader *)
                                   CONCAT17(in_stack_fffffffffffffda7,
                                            CONCAT16(in_stack_fffffffffffffda6,
                                                     CONCAT15(in_stack_fffffffffffffda5,
                                                              in_stack_fffffffffffffda0))),
                                   (TokenType)((ulong)in_stack_fffffffffffffd98 >> 0x20));
      }
      local_8c = (uint)!bVar1;
      Value::~Value((Value *)CONCAT17(in_stack_fffffffffffffd87,in_stack_fffffffffffffd80));
      if (local_8c != 0) goto LAB_001ec8c2;
    }
    uVar2 = std::__cxx11::string::length();
    if (0x3fffffff < uVar2) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_f8,"keylength >= 2^30",&local_f9);
      throwRuntimeError((String *)
                        CONCAT17(in_stack_fffffffffffffd97,
                                 CONCAT16(in_stack_fffffffffffffd96,
                                          CONCAT15(in_stack_fffffffffffffd95,
                                                   in_stack_fffffffffffffd90))));
    }
    if ((*(byte *)(in_RDI + 0x10e) & 1) != 0) {
      currentValue((OurReader *)0x1ec367);
      bVar1 = Value::isMember((Value *)CONCAT17(in_stack_fffffffffffffd97,
                                                CONCAT16(in_stack_fffffffffffffd96,
                                                         CONCAT15(in_stack_fffffffffffffd95,
                                                                  in_stack_fffffffffffffd90))),
                              in_stack_fffffffffffffd88);
      if (bVar1) {
        std::operator+((char *)CONCAT17(bVar1,CONCAT16(in_stack_fffffffffffffdce,
                                                       CONCAT15(in_stack_fffffffffffffdcd,
                                                                in_stack_fffffffffffffdc8))),
                       in_stack_fffffffffffffdc0);
        std::operator+(in_stack_fffffffffffffd88,
                       (char *)CONCAT17(in_stack_fffffffffffffd87,in_stack_fffffffffffffd80));
        std::__cxx11::string::~string(local_140);
        local_1 = addErrorAndRecover((OurReader *)
                                     CONCAT17(in_stack_fffffffffffffd97,
                                              CONCAT16(in_stack_fffffffffffffd96,
                                                       CONCAT15(in_stack_fffffffffffffd95,
                                                                in_stack_fffffffffffffd90))),
                                     in_stack_fffffffffffffd88,
                                     (Token *)CONCAT17(in_stack_fffffffffffffd87,
                                                       in_stack_fffffffffffffd80),
                                     in_stack_fffffffffffffd7c);
        local_8c = 1;
        std::__cxx11::string::~string(local_120);
        goto LAB_001ec8c2;
      }
    }
    in_stack_fffffffffffffdcd =
         readToken((OurReader *)
                   CONCAT17(in_stack_fffffffffffffda7,
                            CONCAT16(in_stack_fffffffffffffda6,
                                     CONCAT15(in_stack_fffffffffffffda5,in_stack_fffffffffffffda0)))
                   ,in_stack_fffffffffffffd98);
    if ((!(bool)in_stack_fffffffffffffdcd) || (local_158 != 0xe)) {
      paVar3 = &local_179;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_178,"Missing \':\' after object member name",paVar3);
      local_1 = addErrorAndRecover((OurReader *)
                                   CONCAT17(in_stack_fffffffffffffd97,
                                            CONCAT16(in_stack_fffffffffffffd96,
                                                     CONCAT15(in_stack_fffffffffffffd95,
                                                              in_stack_fffffffffffffd90))),
                                   in_stack_fffffffffffffd88,
                                   (Token *)CONCAT17(in_stack_fffffffffffffd87,
                                                     in_stack_fffffffffffffd80),
                                   in_stack_fffffffffffffd7c);
      std::__cxx11::string::~string(local_178);
      std::allocator<char>::~allocator((allocator<char> *)&local_179);
      local_8c = 1;
      goto LAB_001ec8c2;
    }
    in_stack_fffffffffffffdb0 = currentValue((OurReader *)0x1ec58f);
    in_stack_fffffffffffffda8 =
         Value::operator[]((Value *)CONCAT17(in_stack_fffffffffffffd97,
                                             CONCAT16(in_stack_fffffffffffffd96,
                                                      CONCAT15(in_stack_fffffffffffffd95,
                                                               in_stack_fffffffffffffd90))),
                           in_stack_fffffffffffffd88);
    std::stack<Json::Value_*,_std::deque<Json::Value_*,_std::allocator<Json::Value_*>_>_>::push
              ((stack<Json::Value_*,_std::deque<Json::Value_*,_std::allocator<Json::Value_*>_>_> *)
               CONCAT17(in_stack_fffffffffffffd87,in_stack_fffffffffffffd80),
               (value_type *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
    bVar1 = readValue(in_stack_00000008);
    in_stack_fffffffffffffda7 = bVar1;
    std::stack<Json::Value_*,_std::deque<Json::Value_*,_std::allocator<Json::Value_*>_>_>::pop
              ((stack<Json::Value_*,_std::deque<Json::Value_*,_std::allocator<Json::Value_*>_>_> *)
               0x1ec610);
    if (!bVar1) {
      local_1 = recoverFromError((OurReader *)
                                 CONCAT17(in_stack_fffffffffffffda7,
                                          CONCAT16(in_stack_fffffffffffffda6,
                                                   CONCAT15(in_stack_fffffffffffffda5,
                                                            in_stack_fffffffffffffda0))),
                                 (TokenType)((ulong)in_stack_fffffffffffffd98 >> 0x20));
      local_8c = 1;
      goto LAB_001ec8c2;
    }
    in_stack_fffffffffffffda5 =
         readToken((OurReader *)
                   CONCAT17(in_stack_fffffffffffffda7,
                            CONCAT16(in_stack_fffffffffffffda6,
                                     CONCAT15(in_stack_fffffffffffffda5,in_stack_fffffffffffffda0)))
                   ,in_stack_fffffffffffffd98);
    if ((!(bool)in_stack_fffffffffffffda5) ||
       (((in_stack_fffffffffffffe50 != 2 && (in_stack_fffffffffffffe50 != 0xd)) &&
        (in_stack_fffffffffffffe50 != 0xf)))) {
      paVar3 = &local_1d1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_1d0,"Missing \',\' or \'}\' in object declaration",paVar3);
      local_1 = addErrorAndRecover((OurReader *)
                                   CONCAT17(in_stack_fffffffffffffd97,
                                            CONCAT16(in_stack_fffffffffffffd96,
                                                     CONCAT15(in_stack_fffffffffffffd95,
                                                              in_stack_fffffffffffffd90))),
                                   in_stack_fffffffffffffd88,
                                   (Token *)CONCAT17(in_stack_fffffffffffffd87,
                                                     in_stack_fffffffffffffd80),
                                   in_stack_fffffffffffffd7c);
      std::__cxx11::string::~string(local_1d0);
      std::allocator<char>::~allocator((allocator<char> *)&local_1d1);
      local_8c = 1;
      goto LAB_001ec8c2;
    }
    local_1d2 = true;
    while( true ) {
      bVar1 = false;
      if (in_stack_fffffffffffffe50 == 0xf) {
        bVar1 = local_1d2;
      }
      if (bVar1 == false) break;
      in_stack_fffffffffffffd95 =
           readToken((OurReader *)
                     CONCAT17(in_stack_fffffffffffffda7,
                              CONCAT16(in_stack_fffffffffffffda6,
                                       CONCAT15(in_stack_fffffffffffffda5,in_stack_fffffffffffffda0)
                                      )),in_stack_fffffffffffffd98);
      local_1d2 = (bool)in_stack_fffffffffffffd95;
    }
    if (in_stack_fffffffffffffe50 == 2) {
      local_1 = 1;
      local_8c = 1;
      goto LAB_001ec8c2;
    }
    in_stack_fffffffffffffd96 = 0;
  }
  message = (String *)local_1f9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)(local_1f9 + 1),"Missing \'}\' or object member name",(allocator *)message);
  in_stack_fffffffffffffd87 =
       addErrorAndRecover((OurReader *)
                          CONCAT17(in_stack_fffffffffffffd97,
                                   CONCAT16(in_stack_fffffffffffffd96,
                                            CONCAT15(in_stack_fffffffffffffd95,
                                                     in_stack_fffffffffffffd90))),message,
                          (Token *)CONCAT17(in_stack_fffffffffffffd87,in_stack_fffffffffffffd80),
                          in_stack_fffffffffffffd7c);
  local_1 = in_stack_fffffffffffffd87;
  std::__cxx11::string::~string((string *)(local_1f9 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_1f9);
  local_8c = 1;
LAB_001ec8c2:
  Value::~Value((Value *)CONCAT17(in_stack_fffffffffffffd87,in_stack_fffffffffffffd80));
  std::__cxx11::string::~string(local_50);
  return (bool)(local_1 & 1);
}

Assistant:

bool OurReader::readObject(Token& token) {
  Token tokenName;
  String name;
  Value init(objectValue);
  currentValue().swapPayload(init);
  currentValue().setOffsetStart(token.start_ - begin_);
  while (readToken(tokenName)) {
    bool initialTokenOk = true;
    while (tokenName.type_ == tokenComment && initialTokenOk)
      initialTokenOk = readToken(tokenName);
    if (!initialTokenOk)
      break;
    if (tokenName.type_ == tokenObjectEnd && name.empty()) // empty object
      return true;
    name.clear();
    if (tokenName.type_ == tokenString) {
      if (!decodeString(tokenName, name))
        return recoverFromError(tokenObjectEnd);
    } else if (tokenName.type_ == tokenNumber && features_.allowNumericKeys_) {
      Value numberName;
      if (!decodeNumber(tokenName, numberName))
        return recoverFromError(tokenObjectEnd);
      name = numberName.asString();
    } else {
      break;
    }
    if (name.length() >= (1U << 30))
      throwRuntimeError("keylength >= 2^30");
    if (features_.rejectDupKeys_ && currentValue().isMember(name)) {
      String msg = "Duplicate key: '" + name + "'";
      return addErrorAndRecover(msg, tokenName, tokenObjectEnd);
    }

    Token colon;
    if (!readToken(colon) || colon.type_ != tokenMemberSeparator) {
      return addErrorAndRecover("Missing ':' after object member name", colon,
                                tokenObjectEnd);
    }
    Value& value = currentValue()[name];
    nodes_.push(&value);
    bool ok = readValue();
    nodes_.pop();
    if (!ok) // error already set
      return recoverFromError(tokenObjectEnd);

    Token comma;
    if (!readToken(comma) ||
        (comma.type_ != tokenObjectEnd && comma.type_ != tokenArraySeparator &&
         comma.type_ != tokenComment)) {
      return addErrorAndRecover("Missing ',' or '}' in object declaration",
                                comma, tokenObjectEnd);
    }
    bool finalizeTokenOk = true;
    while (comma.type_ == tokenComment && finalizeTokenOk)
      finalizeTokenOk = readToken(comma);
    if (comma.type_ == tokenObjectEnd)
      return true;
  }
  return addErrorAndRecover("Missing '}' or object member name", tokenName,
                            tokenObjectEnd);
}